

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O2

bool clusterDBSCAN(TSimilarityMap *sim,TValueCC epsCC,int minPts,TKeyPressCollection *keyPresses)

{
  pointer psVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  TClusterId *pTVar5;
  pointer piVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int local_8c;
  vector<int,_std::allocator<int>_> nbi;
  vector<int,_std::allocator<int>_> nbq;
  
  psVar1 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x30;
  lVar4 = 0;
  iVar9 = (int)uVar3;
  uVar7 = 0;
  if (0 < iVar9) {
    uVar7 = uVar3 & 0xffffffff;
  }
  for (; uVar7 * 0x30 - lVar4 != 0; lVar4 = lVar4 + 0x30) {
    *(undefined4 *)((long)&psVar1->cid + lVar4) = 0xffffffff;
  }
  iVar8 = 0;
  for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
    psVar1 = (keyPresses->
             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (psVar1[uVar3].cid == -1) {
      nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pTVar5 = &psVar1[uVar3].cid;
      nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      for (iVar2 = 0;
          nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
               = (pointer)CONCAT44(nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar2), iVar2 < iVar9;
          iVar2 = iVar2 + 1) {
        if (epsCC < *(double *)
                     (*(long *)&(sim->
                                super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar3].
                                super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                super__Vector_impl_data + (long)iVar2 * 0x10)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&nbi,(value_type_conflict *)&nbq.super__Vector_base<int,_std::allocator<int>_>)
          ;
          iVar2 = (int)nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
      }
      if ((int)((ulong)((long)nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) < minPts) {
        *pTVar5 = 0;
      }
      else {
        iVar8 = iVar8 + 1;
        *pTVar5 = iVar8;
        piVar6 = nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        for (lVar4 = 0;
            lVar4 < (int)((ulong)((long)nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar6) >> 2);
            lVar4 = lVar4 + 1) {
          pTVar5 = &(keyPresses->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar6[lVar4]].cid;
          iVar2 = *pTVar5;
          if (*pTVar5 == 0) {
            *pTVar5 = iVar8;
            iVar2 = iVar8;
          }
          if (iVar2 == -1) {
            *pTVar5 = iVar8;
            nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            for (local_8c = 0; local_8c < iVar9; local_8c = local_8c + 1) {
              if (epsCC < *(double *)
                           (*(long *)&(sim->
                                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar4]].
                                      super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                      super__Vector_impl_data + (long)local_8c * 0x10)) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           &nbq.super__Vector_base<int,_std::allocator<int>_>,&local_8c);
              }
            }
            if (minPts <= (int)((ulong)((long)nbq.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)nbq.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
              std::vector<int,std::allocator<int>>::
              insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&nbi,
                         (const_iterator)
                         nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         nbq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&nbq.super__Vector_base<int,_std::allocator<int>_>);
            piVar6 = nbi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&nbi.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return true;
}

Assistant:

bool clusterDBSCAN(const TSimilarityMap & sim, TValueCC epsCC, int minPts, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = -1;
    }

    int curId = 0;

    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        if (cid != -1) continue;
        std::vector<int> nbi;
        for (int j = 0; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            if (cc > epsCC) nbi.push_back(j);
        }

        if ((int) nbi.size() < minPts) {
            cid = 0;
            continue;
        }

        cid = ++curId;
        for (int q = 0; q < (int) nbi.size(); ++q) {
            auto & qcid = keyPresses[nbi[q]].cid;

            if (qcid == 0) qcid = curId;
            if (qcid != -1) continue;
            qcid = curId;

            std::vector<int> nbq;
            for (int j = 0; j < n; ++j) {
                auto & cc = sim[nbi[q]][j].cc;

                if (cc > epsCC) nbq.push_back(j);
            }

            if ((int) nbq.size() >= minPts) {
                nbi.insert(nbi.end(), nbq.begin(), nbq.end());
            }
        }
    }

    return true;
}